

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::fillWithGrid(PixelBufferAccess *access,int cellSize,Vec4 *colorA,Vec4 *colorB)

{
  ChannelOrder CVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Vec4 *pVVar6;
  int y;
  PixelBufferAccess local_80;
  Vec4 local_58;
  Vec4 local_48;
  
  uVar3 = (ulong)(access->super_ConstPixelBufferAccess).m_format.type;
  if ((0x25 < uVar3) || ((0x2007000000U >> (uVar3 & 0x3f) & 1) == 0)) {
    iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
    iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    if (iVar4 == 1) {
      if (iVar2 == 1) {
        if ((access->super_ConstPixelBufferAccess).m_size.m_data[0] < 1) {
          return;
        }
        iVar4 = 0;
        do {
          pVVar6 = colorA;
          if (((long)iVar4 / (long)cellSize & 1U) != 0) {
            pVVar6 = colorB;
          }
          PixelBufferAccess::setPixel(access,pVVar6,iVar4,0,0);
          iVar4 = iVar4 + 1;
        } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
        return;
      }
    }
    else if (iVar2 == 1) {
      if (iVar4 < 1) {
        return;
      }
      iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
      iVar5 = 0;
      do {
        if (0 < iVar2) {
          iVar4 = 0;
          do {
            iVar2 = (int)((long)iVar4 / (long)cellSize);
            pVVar6 = colorA;
            if (iVar2 - (((uint)((ulong)((long)iVar4 / (long)cellSize) >> 0x1f) & 1) + iVar2 &
                        0xfffffffe) != (iVar5 / cellSize) % 2) {
              pVVar6 = colorB;
            }
            PixelBufferAccess::setPixel(access,pVVar6,iVar4,iVar5,0);
            iVar4 = iVar4 + 1;
            iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
          } while (iVar4 < iVar2);
          iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < iVar4);
      return;
    }
    if (iVar2 < 1) {
      return;
    }
    iVar5 = 0;
    do {
      if (0 < iVar4) {
        iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        y = 0;
        do {
          if (0 < iVar2) {
            iVar4 = 0;
            do {
              iVar2 = (int)((long)iVar4 / (long)cellSize);
              pVVar6 = colorA;
              if ((iVar2 - (((uint)((ulong)((long)iVar4 / (long)cellSize) >> 0x1f) & 1) + iVar2 &
                           0xfffffffe) ^ (y / cellSize) % 2) != (iVar5 / cellSize) % 2) {
                pVVar6 = colorB;
              }
              PixelBufferAccess::setPixel(access,pVVar6,iVar4,y,iVar5);
              iVar4 = iVar4 + 1;
              iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            } while (iVar4 < iVar2);
            iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
          }
          y = y + 1;
        } while (y < iVar4);
        iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar2);
    return;
  }
  CVar1 = (access->super_ConstPixelBufferAccess).m_format.order;
  if (CVar1 == DS) {
    getEffectiveDepthStencilAccess(&local_80,access,MODE_DEPTH);
    fillWithGrid(&local_80,cellSize,colorA,colorB);
  }
  else if (CVar1 != S) {
    if (CVar1 != D) {
      return;
    }
    getEffectiveDepthStencilAccess(&local_80,access,MODE_DEPTH);
    goto LAB_019b8ac4;
  }
  getEffectiveDepthStencilAccess(&local_80,access,MODE_STENCIL);
  local_48.m_data[3] = colorA->m_data[0];
  local_48.m_data[2] = colorA->m_data[1];
  local_48.m_data[1] = colorA->m_data[2];
  local_48.m_data[0] = colorA->m_data[3];
  colorA = &local_48;
  local_58.m_data[3] = colorB->m_data[0];
  local_58.m_data[2] = colorB->m_data[1];
  local_58.m_data[1] = colorB->m_data[2];
  local_58.m_data[0] = colorB->m_data[3];
  colorB = &local_58;
LAB_019b8ac4:
  fillWithGrid(&local_80,cellSize,colorA,colorB);
  return;
}

Assistant:

void fillWithGrid (const PixelBufferAccess& access, int cellSize, const Vec4& colorA, const Vec4& colorB)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), cellSize, colorA, colorB);
		if (hasStencil)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), cellSize, colorA.swizzle(3,2,1,0), colorB.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithGrid1D(access, cellSize, colorA, colorB);
		else if (access.getDepth() == 1)
			fillWithGrid2D(access, cellSize, colorA, colorB);
		else
			fillWithGrid3D(access, cellSize, colorA, colorB);
	}
}